

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PrepareStatement(sqlite3_stmt **ppStmt,Fts5Config *pConfig,char *zFmt,...)

{
  long lVar1;
  char *pcVar2;
  sqlite3 *in_RCX;
  Fts5Config *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *zSql;
  int rc;
  sqlite3_stmt *pRet;
  va_list ap;
  char **in_stack_fffffffffffffef0;
  sqlite3 *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  int local_4c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = sqlite3_vmprintf((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            (__va_list_tag *)in_stack_fffffffffffffef8);
  if (pcVar2 == (char *)0x0) {
    local_4c = 7;
  }
  else {
    local_4c = sqlite3_prepare_v3(in_RCX,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                                  in_stack_ffffffffffffff00,
                                  (sqlite3_stmt **)in_stack_fffffffffffffef8,
                                  in_stack_fffffffffffffef0);
    if (local_4c != 0) {
      pcVar2 = sqlite3_errmsg(in_stack_fffffffffffffef8);
      sqlite3Fts5ConfigErrmsg(in_RSI,"%s",pcVar2);
    }
    sqlite3_free((void *)0x28267f);
  }
  *in_RDI = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_4c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PrepareStatement(
  sqlite3_stmt **ppStmt,
  Fts5Config *pConfig,
  const char *zFmt,
  ...
){
  sqlite3_stmt *pRet = 0;
  int rc;
  char *zSql;
  va_list ap;

  va_start(ap, zFmt);
  zSql = sqlite3_vmprintf(zFmt, ap);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v3(pConfig->db, zSql, -1,
                            SQLITE_PREPARE_PERSISTENT, &pRet, 0);
    if( rc!=SQLITE_OK ){
      sqlite3Fts5ConfigErrmsg(pConfig, "%s", sqlite3_errmsg(pConfig->db));
    }
    sqlite3_free(zSql);
  }

  va_end(ap);
  *ppStmt = pRet;
  return rc;
}